

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBlendTests.cpp
# Opt level: O1

void deqp::gles3::Functional::sRGBAToLinear(PixelBufferAccess *dst,ConstPixelBufferAccess *src)

{
  int iVar1;
  int iVar2;
  int z;
  int y;
  tcu local_40 [16];
  
  iVar1 = (src->m_size).m_data[1];
  if (0 < iVar1) {
    iVar2 = (src->m_size).m_data[0];
    z = 0;
    do {
      if (0 < iVar2) {
        y = 0;
        do {
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)&stack0xffffffffffffffb0,(int)src,y,z);
          tcu::sRGBToLinear(local_40,(Vec4 *)&stack0xffffffffffffffb0);
          tcu::PixelBufferAccess::setPixel(dst,(Vec4 *)local_40,y,z,0);
          y = y + 1;
        } while (iVar2 != y);
      }
      z = z + 1;
    } while (z != iVar1);
  }
  return;
}

Assistant:

static void sRGBAToLinear (const tcu::PixelBufferAccess& dst, const tcu::ConstPixelBufferAccess& src)
{
	const int	width	= src.getWidth();
	const int	height	= src.getHeight();

	for (int y = 0; y < height; y++)
	for (int x = 0; x < width; x++)
		dst.setPixel(tcu::sRGBToLinear(src.getPixel(x, y)), x, y);
}